

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O3

Status __thiscall
ot::commissioner::persistent_storage::Registry::DeleteBorderRoutersInDomain
          (Registry *this,string *aDomainName)

{
  bool bVar1;
  pointer puVar2;
  char cVar3;
  Status SVar4;
  int iVar5;
  pointer puVar6;
  DomainArray doms;
  StringArray aUnresolved;
  vector<unsigned_long,_std::allocator<unsigned_long>_> xpans;
  StringArray aAliases;
  Domain currentDomain;
  Domain dom;
  Network current;
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  undefined1 local_e0 [24];
  char local_c8 [16];
  undefined1 local_b8 [8];
  _Alloc_hider local_b0;
  char local_a0 [16];
  Network local_90;
  
  Domain::Domain((Domain *)local_b8);
  local_158.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Network::Network(&local_90);
  local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)&local_b0);
  iVar5 = (*this->mStorage->_vptr_PersistentStorage[0x15])(this->mStorage,local_b8,&local_158);
  cVar3 = (char)iVar5;
  SVar4 = kNotFound;
  if (cVar3 != '\x01') {
    SVar4 = (cVar3 != '\0') << 2;
  }
  if (((cVar3 != '\0') ||
      (SVar4 = kError,
      (long)local_158.
            super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_158.
            super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x28)) ||
     (SVar4 = GetCurrentNetwork(this,&local_90), SVar4 != kSuccess)) goto LAB_00265033;
  if (local_90.mDomainId.mId != 0xffffffff) {
    Domain::Domain((Domain *)local_e0);
    iVar5 = (*this->mStorage->_vptr_PersistentStorage[0xd])
                      (this->mStorage,&local_90.mDomainId,local_e0);
    cVar3 = (char)iVar5;
    SVar4 = kNotFound;
    if (cVar3 != '\x01') {
      SVar4 = (cVar3 != '\0') << 2;
    }
    if (cVar3 == '\0') {
      if (local_e0._16_8_ == aDomainName->_M_string_length) {
        if (local_e0._16_8_ == 0) {
          SVar4 = kRestricted;
          goto LAB_00264fbd;
        }
        iVar5 = bcmp((void *)local_e0._8_8_,(aDomainName->_M_dataplus)._M_p,local_e0._16_8_);
        bVar1 = iVar5 != 0;
        SVar4 = (iVar5 == 0) * '\x05';
      }
      else {
        bVar1 = true;
        SVar4 = kSuccess;
      }
    }
    else {
LAB_00264fbd:
      bVar1 = false;
    }
    if ((char *)local_e0._8_8_ != local_c8) {
      operator_delete((void *)local_e0._8_8_);
    }
    if (!bVar1) goto LAB_00265033;
  }
  SVar4 = GetNetworkXpansInDomain(this,aDomainName,&local_118);
  puVar2 = local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (SVar4 == kSuccess) {
    if (local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      iVar5 = (*this->mStorage->_vptr_PersistentStorage[9])
                        (this->mStorage,
                         local_158.
                         super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      SVar4 = kNotFound;
      if ((char)iVar5 != '\x01') {
        SVar4 = ((char)iVar5 != '\0') << 2;
      }
    }
    else {
      puVar6 = local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        utils::Hex<unsigned_long>((string *)local_e0,*puVar6);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
                   (string *)local_e0);
        if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
          operator_delete((void *)local_e0._0_8_);
        }
        puVar6 = puVar6 + 1;
      } while (puVar6 != puVar2);
      SVar4 = DeleteBorderRoutersInNetworks(this,&local_f8,&local_138);
      if (SVar4 == kSuccess) {
        SVar4 = (local_138.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                local_138.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) * '\x03';
      }
    }
  }
LAB_00265033:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  if (local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.mMlp._M_dataplus._M_p != &local_90.mMlp.field_2) {
    operator_delete(local_90.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.mName._M_dataplus._M_p != &local_90.mName.field_2) {
    operator_delete(local_90.mName._M_dataplus._M_p);
  }
  std::
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ::~vector(&local_158);
  if (local_b0._M_p != local_a0) {
    operator_delete(local_b0._M_p);
  }
  return SVar4;
}

Assistant:

Registry::Status Registry::DeleteBorderRoutersInDomain(const std::string &aDomainName)
{
    Domain                dom;
    DomainArray           doms;
    Registry::Status      status;
    Network               current;
    std::vector<uint64_t> xpans;
    StringArray           aAliases;
    StringArray           aUnresolved;

    dom.mName = aDomainName;
    VerifyOrExit((status = MapStatus(mStorage->Lookup(dom, doms))) == Registry::Status::kSuccess);
    VerifyOrExit(doms.size() == 1, status = Registry::Status::kError);

    VerifyOrExit((status = GetCurrentNetwork(current)) == Registry::Status::kSuccess);
    if (current.mDomainId.mId != EMPTY_ID)
    {
        Domain currentDomain;
        VerifyOrExit((status = MapStatus(mStorage->Get(current.mDomainId, currentDomain))) ==
                     Registry::Status::kSuccess);
        VerifyOrExit(currentDomain.mName != aDomainName, status = Registry::Status::kRestricted);
    }

    VerifyOrExit((status = GetNetworkXpansInDomain(aDomainName, xpans)) == Registry::Status::kSuccess);
    VerifyOrExit(!xpans.empty(), status = MapStatus(mStorage->Del(doms[0].mId)));

    for (auto &&xpan : xpans)
    {
        aAliases.push_back(utils::Hex(xpan));
    }
    VerifyOrExit((status = DeleteBorderRoutersInNetworks(aAliases, aUnresolved)) == Registry::Status::kSuccess);
    VerifyOrExit(aUnresolved.empty(), status = Registry::Status::kAmbiguity);
    // Domain will be deleted
exit:
    return status;
}